

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bulk.c
# Opt level: O1

void ecs_bulk_remove_type(ecs_world_t *world,ecs_type_t to_remove,ecs_filter_t *filter)

{
  ecs_sparse_t *peVar1;
  bool condition;
  long lVar2;
  undefined8 uVar3;
  _Bool _Var4;
  int32_t iVar5;
  ecs_stage_t *peVar6;
  ecs_table_t *table;
  ecs_table_t *dst_table;
  int dense_index;
  ecs_entities_t eVar7;
  code *pcStack_60;
  undefined1 local_58 [8];
  ecs_entities_t to_remove_array;
  ecs_entities_t removed;
  ecs_world_t *world_local;
  
  pcStack_60 = (code *)0x13250d;
  removed._8_8_ = world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0xfe);
  if (removed._8_8_ == 0) {
    pcStack_60 = (code *)0x132736;
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,0xfe,"void ecs_bulk_remove_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)"
                 );
  }
  pcStack_60 = (code *)0x132541;
  _ecs_assert(to_remove != (ecs_type_t)0x0,2,(char *)0x0,"to_remove != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0xff);
  if (to_remove != (ecs_type_t)0x0) {
    pcStack_60 = (code *)0x132556;
    peVar6 = ecs_get_stage((ecs_world_t **)&removed.count);
    pcStack_60 = (code *)0x13258e;
    _ecs_assert(peVar6 == (ecs_stage_t *)(removed._8_8_ + 0x5b08),0x23,(char *)0x0,
                "stage == &world->stage",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,0x102);
    if (peVar6 != (ecs_stage_t *)(removed._8_8_ + 0x5b08)) {
      pcStack_60 = ecs_bulk_remove_entity;
      __assert_fail("stage == &world->stage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                    ,0x102,
                    "void ecs_bulk_remove_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)");
    }
    pcStack_60 = (code *)0x1325a2;
    eVar7 = ecs_type_to_entities(to_remove);
    local_58 = (undefined1  [8])eVar7.array;
    to_remove_array.array._0_4_ = eVar7.count;
    lVar2 = -((long)((int)to_remove_array.array << 3) + 0xfU & 0xfffffffffffffff0);
    to_remove_array._8_8_ = local_58 + lVar2;
    removed.array._0_4_ = 0;
    peVar1 = *(ecs_sparse_t **)(removed._8_8_ + 0x4830);
    *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x1325db;
    iVar5 = ecs_sparse_count(peVar1);
    if (0 < iVar5) {
      dense_index = 0;
      do {
        peVar1 = *(ecs_sparse_t **)(removed._8_8_ + 0x4830);
        *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x132601;
        table = (ecs_table_t *)_ecs_sparse_get(peVar1,0x80,dense_index);
        uVar3 = removed._8_8_;
        if ((table->flags & 1) == 0) {
          *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x13261d;
          _Var4 = ecs_table_match_filter((ecs_world_t *)uVar3,table,filter);
          uVar3 = removed._8_8_;
          if (_Var4) {
            *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x132639;
            dst_table = ecs_table_traverse_remove
                                  ((ecs_world_t *)uVar3,table,(ecs_entities_t *)local_58,
                                   (ecs_entities_t *)&to_remove_array.count);
            condition = (int)removed.array <= (int)to_remove_array.array;
            *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x132668;
            _ecs_assert(condition,0xc,(char *)0x0,"removed.count <= to_remove_array.count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                        ,0x11a);
            if ((int)to_remove_array.array < (int)removed.array) {
              *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x1326f8;
              __assert_fail("removed.count <= to_remove_array.count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                            ,0x11a,
                            "void ecs_bulk_remove_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)"
                           );
            }
            if ((int)removed.array != 0) {
              *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x13269d;
              _ecs_assert(dst_table != (ecs_table_t *)0x0,0xc,(char *)0x0,"dst_table != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                          ,0x120);
              uVar3 = removed._8_8_;
              if (dst_table == (ecs_table_t *)0x0) {
                *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x132717;
                __assert_fail("dst_table != ((void*)0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                              ,0x120,
                              "void ecs_bulk_remove_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)"
                             );
              }
              *(undefined8 *)((long)&pcStack_60 + lVar2) = 0x1326b7;
              merge_table((ecs_world_t *)uVar3,dst_table,table,(ecs_entities_t *)0x0,
                          (ecs_entities_t *)&to_remove_array.count);
              removed.array._0_4_ = 0;
            }
          }
        }
        dense_index = dense_index + 1;
      } while (iVar5 != dense_index);
    }
    return;
  }
  pcStack_60 = (code *)0x132755;
  __assert_fail("to_remove != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,0xff,"void ecs_bulk_remove_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)");
}

Assistant:

void ecs_bulk_remove_type(
    ecs_world_t *world,
    ecs_type_t to_remove,
    const ecs_filter_t *filter)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(to_remove != NULL, ECS_INVALID_PARAMETER, NULL);

    ecs_stage_t *stage = ecs_get_stage(&world);
    ecs_assert(stage == &world->stage, ECS_UNSUPPORTED, NULL);
    (void)stage;

    ecs_entities_t to_remove_array = ecs_type_to_entities(to_remove);
    ecs_entities_t removed = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * to_remove_array.count),
        .count = 0
    };

    int32_t i, count = ecs_sparse_count(world->store.tables);
    for (i = 0; i < count; i ++) {
        ecs_table_t *table = ecs_sparse_get(world->store.tables, ecs_table_t, i);

        if (table->flags & EcsTableHasBuiltins) {
            continue;
        }

        if (!ecs_table_match_filter(world, table, filter)) {
            continue;
        }
        
        ecs_table_t *dst_table = ecs_table_traverse_remove(
            world, table, &to_remove_array, &removed);

        ecs_assert(removed.count <= to_remove_array.count, ECS_INTERNAL_ERROR, NULL);

        if (!removed.count) {
            continue;
        }

        ecs_assert(dst_table != NULL, ECS_INTERNAL_ERROR, NULL);
        merge_table(world, dst_table, table, NULL, &removed);
        removed.count = 0;        
    }    
}